

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O3

void __thiscall miniros::TransportTCP::parseHeader(TransportTCP *this,Header *header)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  string local_68;
  string nodelay;
  
  nodelay._M_string_length = 0;
  nodelay.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  nodelay._M_dataplus._M_p = (pointer)&nodelay.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"tcp_nodelay","");
  bVar2 = Header::getValue(header,&local_68,&nodelay);
  if (bVar2) {
    iVar3 = std::__cxx11::string::compare((char *)&nodelay);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (iVar3 == 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (parseHeader::loc.initialized_ == false) {
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"miniros.transport_tcp","");
        console::initializeLogLocation(&parseHeader::loc,&local_68,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      if (parseHeader::loc.level_ != Debug) {
        console::setLogLocationLevel(&parseHeader::loc,Debug);
        console::checkLogLocationEnabled(&parseHeader::loc);
      }
      if (parseHeader::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,parseHeader::loc.logger_,parseHeader::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                       ,0xa5,"virtual void miniros::TransportTCP::parseHeader(const Header &)",
                       "Setting nodelay on socket [%d]",(ulong)(uint)this->sock_);
      }
      setNoDelay(this,true);
    }
  }
  else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nodelay._M_dataplus._M_p != &nodelay.field_2) {
    operator_delete(nodelay._M_dataplus._M_p,
                    CONCAT71(nodelay.field_2._M_allocated_capacity._1_7_,
                             nodelay.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void TransportTCP::parseHeader(const Header& header)
{
  std::string nodelay;
  if (header.getValue("tcp_nodelay", nodelay) && nodelay == "1")
  {
    MINIROS_DEBUG("Setting nodelay on socket [%d]", sock_);
    setNoDelay(true);
  }
}